

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O0

cstr idx2::ToRawFileName(metadata *Meta)

{
  int iVar1;
  long *in_FS_OFFSET;
  stref sVar2;
  int Written_3;
  stref TypeStr;
  int Written_2;
  int Written_1;
  int Written;
  printer Pr;
  metadata *Meta_local;
  
  Pr.File = (FILE *)Meta;
  printer::printer((printer *)&Written_1,(char *)(*in_FS_OFFSET + -0x180),0x180);
  if ((_Written_1 == (char *)0x0) || (Pr._8_8_ != 0)) {
    if ((_Written_1 != (char *)0x0) || (Pr._8_8_ == 0)) {
      __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x16,"cstr idx2::ToRawFileName(const metadata &)");
    }
    fprintf((FILE *)Pr._8_8_,"%s-",Pr.File);
  }
  else {
    if ((int)Pr.Buf < 2) {
      __assert_fail("false && \"buffer too small\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x16,"cstr idx2::ToRawFileName(const metadata &)");
    }
    iVar1 = snprintf(_Written_1,(long)(int)Pr.Buf,"%s-",Pr.File);
    _Written_1 = _Written_1 + iVar1;
    if ((int)Pr.Buf <= iVar1) {
      __assert_fail("false && \"buffer overflow?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x16,"cstr idx2::ToRawFileName(const metadata &)");
    }
    Pr.Buf._0_4_ = (int)Pr.Buf - iVar1;
  }
  if ((_Written_1 == (char *)0x0) || (Pr._8_8_ != 0)) {
    if ((_Written_1 != (char *)0x0) || (Pr._8_8_ == 0)) {
      __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x17,"cstr idx2::ToRawFileName(const metadata &)");
    }
    fprintf((FILE *)Pr._8_8_,"%s-",Pr.File + 0x40);
  }
  else {
    if ((int)Pr.Buf < 2) {
      __assert_fail("false && \"buffer too small\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x17,"cstr idx2::ToRawFileName(const metadata &)");
    }
    iVar1 = snprintf(_Written_1,(long)(int)Pr.Buf,"%s-",Pr.File + 0x40);
    _Written_1 = _Written_1 + iVar1;
    if ((int)Pr.Buf <= iVar1) {
      __assert_fail("false && \"buffer overflow?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x17,"cstr idx2::ToRawFileName(const metadata &)");
    }
    Pr.Buf._0_4_ = (int)Pr.Buf - iVar1;
  }
  if ((_Written_1 == (char *)0x0) || (Pr._8_8_ != 0)) {
    if ((_Written_1 != (char *)0x0) || (Pr._8_8_ == 0)) {
      __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x18,"cstr idx2::ToRawFileName(const metadata &)");
    }
    fprintf((FILE *)Pr._8_8_,"[%d-%d-%d]-",(ulong)*(uint *)(Pr.File + 0x80),
            (ulong)*(uint *)(Pr.File + 0x84),(ulong)*(uint *)(Pr.File + 0x88));
  }
  else {
    if ((int)Pr.Buf < 2) {
      __assert_fail("false && \"buffer too small\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x18,"cstr idx2::ToRawFileName(const metadata &)");
    }
    iVar1 = snprintf(_Written_1,(long)(int)Pr.Buf,"[%d-%d-%d]-",(ulong)*(uint *)(Pr.File + 0x80),
                     (ulong)*(uint *)(Pr.File + 0x84),(ulong)*(uint *)(Pr.File + 0x88));
    _Written_1 = _Written_1 + iVar1;
    if ((int)Pr.Buf <= iVar1) {
      __assert_fail("false && \"buffer overflow?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x18,"cstr idx2::ToRawFileName(const metadata &)");
    }
    Pr.Buf._0_4_ = (int)Pr.Buf - iVar1;
  }
  sVar2 = ToString((dtype)Pr.File[0x8c]);
  if ((_Written_1 == (char *)0x0) || (Pr._8_8_ != 0)) {
    if ((_Written_1 != (char *)0x0) || (Pr._8_8_ == 0)) {
      __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x1a,"cstr idx2::ToRawFileName(const metadata &)");
    }
    fprintf((FILE *)Pr._8_8_,"%.*s",(ulong)(uint)sVar2.Size,sVar2.field_0.Ptr);
  }
  else {
    if ((int)Pr.Buf < 2) {
      __assert_fail("false && \"buffer too small\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x1a,"cstr idx2::ToRawFileName(const metadata &)");
    }
    iVar1 = snprintf(_Written_1,(long)(int)Pr.Buf,"%.*s",(ulong)(uint)sVar2.Size,sVar2.field_0.Ptr);
    _Written_1 = _Written_1 + iVar1;
    if ((int)Pr.Buf <= iVar1) {
      __assert_fail("false && \"buffer overflow?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
                    ,0x1a,"cstr idx2::ToRawFileName(const metadata &)");
    }
  }
  return (cstr)(*in_FS_OFFSET + -0x180);
}

Assistant:

cstr
ToRawFileName(const metadata& Meta)
{
  printer Pr(Meta.String, sizeof(Meta.String));
  idx2_Print(&Pr, "%s-", Meta.Name);
  idx2_Print(&Pr, "%s-", Meta.Field);
  idx2_Print(&Pr, "[%d-%d-%d]-", Meta.Dims3.X, Meta.Dims3.Y, Meta.Dims3.Z);
  stref TypeStr = ToString(Meta.DType);
  idx2_Print(&Pr, "%.*s", TypeStr.Size, TypeStr.Ptr);

  return Meta.String;
}